

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::updateIndexedViews
          (ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  int iVar1;
  int iVar2;
  pointer ptVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  ManagedBuffer<unsigned_int> *this_01;
  _Atomic_word _Var5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *perm;
  pointer ptVar6;
  bool bVar7;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  expandData;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  local_48;
  
  checkDeviceBufferTypeIs(this,Attribute);
  removeDeletedIndexedViews(this);
  ptVar6 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar3 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar6 != ptVar3) {
    do {
      this_00 = (ptVar6->
                super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                ).super__Tuple_impl<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>_>.
                super__Head_base<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>,_false>.
                _M_head_impl.
                super___weak_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var5 = this_00->_M_use_count;
        do {
          if (_Var5 == 0) goto LAB_002235d3;
          iVar1 = _Var5 + 1;
          LOCK();
          iVar2 = this_00->_M_use_count;
          bVar7 = _Var5 == iVar2;
          if (bVar7) {
            this_00->_M_use_count = iVar1;
            iVar2 = _Var5;
          }
          _Var5 = iVar2;
          UNLOCK();
        } while (!bVar7);
        peVar4 = (ptVar6->
                 super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                 ).super__Tuple_impl<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>_>.
                 super__Head_base<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>,_false>.
                 _M_head_impl.
                 super___weak_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        bVar7 = this_00->_M_use_count != 0;
        perm = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               (ulong)CONCAT31((int3)((uint)iVar1 >> 8),peVar4 != (element_type *)0x0 && bVar7);
        if (peVar4 != (element_type *)0x0 && bVar7) {
          this_01 = (ptVar6->
                    super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                    ).super__Head_base<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_false>
                    ._M_head_impl;
          ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(this_01);
          gather<glm::vec<2,unsigned_int,(glm::qualifier)0>>
                    (&local_48,(polyscope *)this->data,
                     (vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                      *)this_01->data,perm);
          (**(code **)((long)peVar4->_vptr_AttributeBuffer + 0x48))(peVar4,&local_48);
          if (local_48.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
LAB_002235d3:
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != ptVar3);
  }
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::updateIndexedViews() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (!viewBufferPtr) continue; // skip if it has been deleted (will be removed eventually)

    // note: index buffer must still be alive here. we can't check it, you will just get memory errors
    // if it has been deleted
    render::ManagedBuffer<uint32_t>& indices = *std::get<0>(existingViewTup);
    render::AttributeBuffer& viewBuffer = *viewBufferPtr;

    // apply the indexing and set the data
    indices.ensureHostBufferPopulated();
    std::vector<T> expandData = gather(data, indices.data);
    viewBuffer.setData(expandData);

    // TODO fornow, only CPU-side updating is supported. Add direct GPU-side support using the bufferIndexCopyProgram
    // below.
  }

  requestRedraw();
}